

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O1

void __thiscall
StreamSummary<4U>::Add_Bucket(StreamSummary<4U> *this,StreamBucket *prev,StreamCounter *counter)

{
  int iVar1;
  StreamBucket *pSVar2;
  StreamCounter *pSVar3;
  Node<int> *pNVar4;
  Node<int> *pNVar5;
  StreamBucket *temp;
  
  pNVar5 = (prev->super_Node<int>).next;
  if (pNVar5 == (Node<int> *)0x0) {
    pNVar5 = (Node<int> *)operator_new(0x20);
    pNVar5->ID = (prev->super_Node<int>).ID + 1;
    pNVar5->prev = (Node<int> *)0x0;
    pNVar5->next = (Node<int> *)0x0;
    *(undefined8 *)(pNVar5 + 1) = 0;
    (prev->super_Node<int>).next = pNVar5;
    pNVar5->prev = &prev->super_Node<int>;
  }
  else {
    iVar1 = (prev->super_Node<int>).ID;
    if (1 < pNVar5->ID - iVar1) {
      pNVar4 = (Node<int> *)operator_new(0x20);
      pNVar4->ID = iVar1 + 1;
      pNVar4->prev = (Node<int> *)0x0;
      pNVar4->next = (Node<int> *)0x0;
      *(undefined8 *)(pNVar4 + 1) = 0;
      (prev->super_Node<int>).next = pNVar4;
      pNVar4->prev = &prev->super_Node<int>;
      pNVar4->next = pNVar5;
      pNVar5->prev = pNVar4;
    }
  }
  pSVar2 = (StreamBucket *)(prev->super_Node<int>).next;
  (counter->super_Node<Data<4U>_>).prev = (Node<Data<4U>_> *)0x0;
  counter->parent = pSVar2;
  pSVar3 = pSVar2->child;
  if (counter != (StreamCounter *)0x0) {
    (counter->super_Node<Data<4U>_>).next = &pSVar3->super_Node<Data<4U>_>;
  }
  if (pSVar3 != (StreamCounter *)0x0) {
    (pSVar3->super_Node<Data<4U>_>).prev = &counter->super_Node<Data<4U>_>;
  }
  pSVar2->child = counter;
  return;
}

Assistant:

void Add_Bucket(StreamBucket* prev, StreamCounter* counter) {
		if (prev->next == NULL) {
			prev->Connect(prev, new StreamBucket(prev->ID + 1));
		}
		else if (prev->next->ID - prev->ID > 1) {
			StreamBucket* temp = (StreamBucket*)prev->next;
			StreamBucket* add = new StreamBucket(prev->ID + 1);
			prev->Connect(prev, add);
			add->Connect(add, temp);
		}

		Counter2Bucket(counter, (StreamBucket*)prev->next);
	}